

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  unsigned_short *puVar1;
  int line_start_idx;
  uint uVar2;
  int iVar3;
  ImWchar *text;
  undefined1 in_R8B;
  int iVar4;
  int iVar5;
  ulong uVar6;
  float fVar7;
  ImVec2 IVar8;
  float fVar9;
  ImWchar *local_38;
  
  iVar3 = str->CurLenW;
  if (iVar3 < 1) {
    return iVar3;
  }
  fVar9 = 0.0;
  uVar6 = 0;
  while( true ) {
    puVar1 = (str->TextW).Data;
    local_38 = (ImWchar *)0x0;
    line_start_idx = (int)uVar6;
    IVar8 = InputTextCalcTextSizeW
                      (puVar1 + line_start_idx,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,
                       (bool)in_R8B);
    iVar5 = (int)((ulong)((long)local_38 - (long)(puVar1 + line_start_idx)) >> 1);
    if (iVar5 < 1) {
      return iVar3;
    }
    if ((y < fVar9) && (line_start_idx == 0)) {
      return 0;
    }
    fVar9 = fVar9 + IVar8.y;
    if (y < fVar9) break;
    uVar6 = (ulong)(uint)(line_start_idx + iVar5);
    if (iVar3 <= line_start_idx + iVar5) {
      return iVar3;
    }
  }
  if (0.0 <= x) {
    if (x < IVar8.x) {
      uVar6 = (long)local_38 + (uVar6 * -2 - (long)puVar1);
      iVar4 = 0;
      iVar3 = 0;
      fVar9 = 0.0;
      do {
        fVar7 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,iVar3);
        if (x < fVar9 + fVar7) {
          uVar6 = (ulong)(uint)(line_start_idx - iVar4);
          if (fVar9 + fVar7 * 0.5 <= x) {
            uVar6 = (ulong)((line_start_idx - iVar4) + 1);
          }
          goto LAB_001f5132;
        }
        iVar3 = iVar3 + 1;
        iVar4 = iVar4 + -1;
        fVar9 = fVar9 + fVar7;
      } while (-(int)(uVar6 >> 1) != iVar4);
    }
    uVar2 = line_start_idx + iVar5;
    if ((str->TextW).Size < (int)uVar2) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x707,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    uVar6 = (ulong)uVar2;
    if ((str->TextW).Data[uVar2 - 1] == 10) {
      uVar6 = (ulong)(uVar2 - 1);
    }
  }
LAB_001f5132:
  return (int)uVar6;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}